

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::shapeAssignTest<false>(ViewTest *this)

{
  int *data;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  undefined8 *puVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  size_t sVar2;
  reference piVar3;
  size_t j;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int *data_00;
  size_t j_8;
  size_t j_18;
  size_t k_1;
  size_t j_1;
  allocator_type local_b1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape0;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape,0,(allocator_type *)&shape0);
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape0);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       v.geometry_.size_ == 1 &&
       sVar2 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
  test((bool *)&shape0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape,1,(allocator_type *)&shape0);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape0);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       v.geometry_.size_ == 0x18 &&
       sVar2 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
  test((bool *)&shape0);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
    test((bool *)&shape0);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == this->data_[uVar4];
    test((bool *)&shape0);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape,2,(allocator_type *)&shape0);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape0);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       v.geometry_.size_ == 0x18 &&
       sVar2 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
  test((bool *)&shape0);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
    test((bool *)&shape0);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5);
      shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ =
           *piVar3 ==
           data[*shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start * uVar5 + uVar4];
      test((bool *)&shape0);
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape,3,(allocator_type *)&shape0);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 3;
  data_00 = this->data2x_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,(allocator_type *)&shape0);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       v.geometry_.size_ == 0x18 &&
       sVar2 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
  test((bool *)&shape0);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
    test((bool *)&shape0);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == data_00[uVar4];
    test((bool *)&shape0);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      uVar6 = 0;
      while( true ) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar2 <= uVar6) break;
        piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5,uVar6);
        shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ =
             *piVar3 ==
             data_00[(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[1] * uVar6 + uVar5) *
                     *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar4];
        test((bool *)&shape0);
        uVar6 = uVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,0,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 1 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&shape0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape0);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,(allocator_type *)&shape0);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       v.geometry_.size_ == 0x18 &&
       sVar2 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
  test((bool *)&shape0);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
    test((bool *)&shape0);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == data_00[uVar4];
    test((bool *)&shape0);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,2,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  *(undefined8 *)
   CONCAT71(shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 6;
  ((undefined8 *)
  CONCAT71(shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._1_7_,
           shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_1_))[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_00._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,&local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == *(size_t *)
                          (CONCAT71(shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4 * 8));
    test((bool *)&local_b1);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    local_b1 = (allocator_type)(*piVar3 == data_00[uVar4]);
    test((bool *)&local_b1);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5);
      local_b1 = (allocator_type)
                 (*piVar3 ==
                 data_00[*(long *)CONCAT71(shape0.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           shape0.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_) * uVar5
                         + uVar4]);
      test((bool *)&local_b1);
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,3,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  puVar1 = (undefined8 *)
           CONCAT71(shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start._1_7_,
                    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start._0_1_);
  *puVar1 = 2;
  puVar1[1] = 4;
  puVar1[2] = 3;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_01._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,&local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == *(size_t *)
                          (CONCAT71(shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4 * 8));
    test((bool *)&local_b1);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    local_b1 = (allocator_type)(*piVar3 == data_00[uVar4]);
    test((bool *)&local_b1);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      uVar6 = 0;
      while( true ) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar2 <= uVar6) break;
        piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5,uVar6);
        local_b1 = (allocator_type)
                   (*piVar3 ==
                   data_00[(((long *)CONCAT71(shape0.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                              shape0.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_1_))[1] *
                            uVar6 + uVar5) *
                           *(long *)CONCAT71(shape0.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             shape0.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                           uVar4]);
        test((bool *)&local_b1);
        uVar6 = uVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,0,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_02._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 1 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,1,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  *(undefined8 *)
   CONCAT71(shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_03._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,&local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == *(size_t *)
                          (CONCAT71(shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4 * 8));
    test((bool *)&local_b1);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    local_b1 = (allocator_type)(*piVar3 == data_00[uVar4]);
    test((bool *)&local_b1);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&shape0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape0);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,(allocator_type *)&shape0);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       v.geometry_.size_ == 0x18 &&
       sVar2 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
  test((bool *)&shape0);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
    test((bool *)&shape0);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5);
      shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ =
           *piVar3 ==
           data_00[*shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start * uVar5 + uVar4];
      test((bool *)&shape0);
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,2,(allocator_type *)&v)
  ;
  begin_04._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 4;
  begin_04._M_current[1] = 6;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,&local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar2 == (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  test((bool *)&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar4]);
    test((bool *)&local_b1);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5);
      local_b1 = (allocator_type)
                 (*piVar3 ==
                 data_00[*shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start * uVar5 + uVar4]);
      test((bool *)&local_b1);
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,3,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_05._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 2;
  begin_05._M_current[1] = 4;
  begin_05._M_current[2] = 3;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == *(size_t *)
                          (CONCAT71(shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4 * 8));
    test((bool *)&local_b1);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    local_b1 = (allocator_type)(*piVar3 == data[uVar4]);
    test((bool *)&local_b1);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      uVar6 = 0;
      while( true ) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar2 <= uVar6) break;
        piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5,uVar6);
        local_b1 = (allocator_type)
                   (*piVar3 ==
                   data[(((long *)CONCAT71(shape0.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           shape0.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_))[1] *
                         uVar6 + uVar5) *
                        *(long *)CONCAT71(shape0.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                          shape0.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4])
        ;
        test((bool *)&local_b1);
        uVar6 = uVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,0,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_06._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 1 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,1,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  *(undefined8 *)
   CONCAT71(shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_07._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,&local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == *(size_t *)
                          (CONCAT71(shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4 * 8));
    test((bool *)&local_b1);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    local_b1 = (allocator_type)(*piVar3 == data_00[uVar4]);
    test((bool *)&local_b1);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,2,(allocator_type *)&v)
  ;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 3;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  begin_08._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_08._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_08._M_current = 6;
  begin_08._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_b1 = (allocator_type)
             (v.geometry_.size_ == 0x18 &&
             sVar2 == (long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
  test((bool *)&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == *(size_t *)
                          (CONCAT71(shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    shape0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar4 * 8));
    test((bool *)&local_b1);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    local_b1 = (allocator_type)(*piVar3 == data[uVar4]);
    test((bool *)&local_b1);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5);
      local_b1 = (allocator_type)
                 (*piVar3 ==
                 data[*(long *)CONCAT71(shape0.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        shape0.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_) * uVar5 +
                      uVar4]);
      test((bool *)&local_b1);
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&shape0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 3;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape0);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,(allocator_type *)&shape0);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
    test((bool *)&shape0);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == data_00[uVar4];
    test((bool *)&shape0);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      uVar6 = 0;
      while( true ) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar2 <= uVar6) break;
        piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5,uVar6);
        shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ =
             *piVar3 ==
             data_00[(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[1] * uVar6 + uVar5) *
                     *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar4];
        test((bool *)&shape0);
        uVar6 = uVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape0,3,(allocator_type *)&v)
  ;
  begin_09._M_current._1_7_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_09._M_current._0_1_ =
       shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_09._M_current = 3;
  begin_09._M_current[1] = 2;
  begin_09._M_current[2] = 4;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 3;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_b1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data_00,&andres::defaultOrder,&andres::defaultOrder
             ,&local_b1);
  for (uVar4 = 0; uVar4 = uVar4 & 0xffff,
      uVar4 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar4);
    local_b1 = (allocator_type)
               (sVar2 == shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar4]);
    test((bool *)&local_b1);
  }
  for (uVar4 = 0; uVar4 < v.geometry_.size_; uVar4 = uVar4 + 1) {
    piVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar4);
    local_b1 = (allocator_type)(*piVar3 == data_00[uVar4]);
    test((bool *)&local_b1);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar4) break;
    uVar5 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar5) break;
      uVar6 = 0;
      while( true ) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar2 <= uVar6) break;
        piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar4,uVar5,uVar6);
        local_b1 = (allocator_type)
                   (*piVar3 ==
                   data_00[(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[1] * uVar6 + uVar5) *
                           *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar4]);
        test((bool *)&local_b1);
        uVar6 = uVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::shapeAssignTest() {
    // scalar... 
    {
        // to scalar
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(0);
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
        }
        // to 2D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data_[j+k*shape[0]]);
                }
            }
        }
        // to 3D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(3);
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
    }
    // 1D... 
    {
        // to scalar 
        { 
            std::vector<std::size_t> shape(1), shape0(0);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
               v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape1D(1), shape2D(2);
            shape1D[0] = 24;
            shape2D[0] = 6;
            shape2D[1] = 4;
            andres::View<int, constTarget> v(shape1D.begin(), shape1D.end(), data_);
            v.assign(shape2D.begin(), shape2D.end(), data2x_);

            test(v.dimension() == shape2D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape2D.size(); ++j) {
                test(v.shape(j) == shape2D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape2D[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape1D(1), shape3D(3);
            shape1D[0] = 24;
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            andres::View<int, constTarget> v(shape1D.begin(), shape1D.end(), data_);
            v.assign(shape3D.begin(), shape3D.end(), data2x_);

            test(v.dimension() == shape3D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape3D.size(); ++j) {
                test(v.shape(j) == shape3D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape3D[0] + p*shape3D[0]*shape3D[1] ]);
                    }
                }
            }
        }
    }
    // 2D... 
    {
        // to scalar
        {
            std::vector<std::size_t> shape2D(2), shape0(0);
            shape2D[0] = 6;
            shape2D[1] = 4; 
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape2D(2), shape1D(1);
            shape2D[0] = 6;
            shape2D[1] = 4; 
            shape1D[0] = 24;
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            v.assign(shape1D.begin(), shape1D.end(), data2x_);

            test(v.dimension() == shape1D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape1D.size(); ++j) {
                test(v.shape(j) == shape1D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape[0]]);
                }
            }
        }
        // to 2D with different shape
        {
            std::vector<std::size_t> shape(2), shapeBefore(2);
            shapeBefore[0] = 4;
            shapeBefore[1] = 6;
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shapeBefore.begin(), shapeBefore.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape2D(2), shape3D(3);
            shape2D[0] = 6;
            shape2D[1] = 4;
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            v.assign(shape3D.begin(), shape3D.end(), data_);

            test(v.dimension() == shape3D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape3D.size(); ++j) {
                test(v.shape(j) == shape3D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data_[ j + k*shape3D[0] + p*shape3D[0]*shape3D[1] ]);
                    }
                }
            }
        }
    }
    // 3D...  
    {
        // to scalar
        {
            std::vector<std::size_t> shape3D(3), shape0(0);
            shape3D[0] = 3;
            shape3D[1] = 4;
            shape3D[2] = 2;
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape3D(3), shape1D(1);
            shape3D[0] = 3;
            shape3D[1] = 4;
            shape3D[2] = 2;
            shape1D[0] = 24; 
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            v.assign(shape1D.begin(), shape1D.end(), data2x_);

            test(v.dimension() == shape1D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape1D.size(); ++j) {
                test(v.shape(j) == shape1D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape3D(3), shape2D(2);
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            shape2D[0] = 6;
            shape2D[1] = 4;
            v.assign(shape2D.begin(), shape2D.end(), data_);
            
            test(v.dimension() == shape2D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape2D.size(); ++j) {
                test(v.shape(j) == shape2D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data_[j+k*shape2D[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
        // to 3D with different shape
        {
            std::vector<std::size_t> shape(3), shapeBefore(3);
            shapeBefore[0] = 3;
            shapeBefore[1] = 2;
            shapeBefore[2] = 4;
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            andres::View<int, constTarget> v(shapeBefore.begin(), shapeBefore.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
    }
}